

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O0

p_range_n * __thiscall dna_bwt_n<dna_string_n>::LF(dna_bwt_n<dna_string_n> *this,range_t rn)

{
  ulong in_RCX;
  ulong in_RDX;
  p_rank_n *in_RSI;
  p_range_n *in_RDI;
  p_rank_n r;
  p_rank_n l;
  p_rank_n f;
  p_rank_n end;
  p_rank_n start;
  p_rank_n local_108;
  p_rank_n local_e0;
  p_rank_n local_b8;
  undefined1 local_90 [40];
  undefined1 local_68 [16];
  uint64_t in_stack_ffffffffffffffa8;
  dna_string_n *in_stack_ffffffffffffffb0;
  p_rank_n local_40;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RDX;
  local_8 = in_RCX;
  dna_string_n::parallel_rank(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_10 < local_8) {
    dna_string_n::parallel_rank(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    memcpy(local_68,local_90,0x28);
  }
  else {
    memcpy(local_68,&local_40,0x28);
  }
  local_b8.A = in_RSI->G;
  local_b8.C = in_RSI->N;
  local_b8.G = in_RSI->T;
  local_b8.N = in_RSI[1].A;
  local_b8.T = in_RSI[1].C;
  p_rank_n::operator+(&local_e0,&local_b8,&local_40);
  p_rank_n::operator+(&local_108,&local_b8,(p_rank_n *)local_68);
  fold_ranks(in_RSI,(p_rank_n *)in_RDI);
  return in_RDI;
}

Assistant:

p_range_n LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank_n start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G,N before end of interval (last position of interval included)
		p_rank_n end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank_n f = {F_A,F_C,F_G,F_N,F_T};
		p_rank_n l = f + start;
		p_rank_n r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.N);
		assert(r.N <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}